

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O1

unsigned_long LocaleIndependentAtoi<unsigned_long>(string_view str)

{
  void *pvVar1;
  size_type sVar2;
  ulong uVar3;
  char *pcVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<unsigned_long> _Var8;
  unsigned_long result;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  long local_30;
  
  pcVar4 = str._M_str;
  uVar5 = str._M_len;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0xffffffffffffffff;
  local_40._M_len = uVar5;
  local_40._M_str = pcVar4;
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      pvVar1 = memchr(" \f\n\r\t\v",(int)pcVar4[uVar6],6);
      uVar3 = uVar6;
      if (pvVar1 == (void *)0x0) break;
      uVar6 = uVar6 + 1;
      uVar3 = 0xffffffffffffffff;
    } while (uVar5 != uVar6);
  }
  if (uVar3 == 0xffffffffffffffff) {
    uVar7 = 0;
    pcVar4 = (char *)0x0;
  }
  else {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                      (&local_40," \f\n\r\t\v",0xffffffffffffffff,6);
    if (local_40._M_len < uVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar3);
      }
      goto LAB_0075e1e6;
    }
    uVar7 = (sVar2 - uVar3) + 1;
    if (local_40._M_len - uVar3 < uVar7) {
      uVar7 = local_40._M_len - uVar3;
    }
    pcVar4 = local_40._M_str + uVar3;
  }
  if ((uVar7 == 0) || (*pcVar4 != '+')) {
LAB_0075e165:
    _Var8 = std::from_chars<unsigned_long>(pcVar4,pcVar4 + uVar7,&local_40._M_len,10);
    uVar5 = local_40._M_len;
    if (_Var8.ec != 0) {
      if ((_Var8.ec != result_out_of_range) || ((uVar7 != 0 && (*pcVar4 == '-'))))
      goto LAB_0075e18e;
      uVar5 = 0xffffffffffffffff;
    }
  }
  else {
    if ((uVar7 == 1) || (pcVar4[1] != '-')) {
      uVar7 = uVar7 - 1;
      pcVar4 = pcVar4 + 1;
      goto LAB_0075e165;
    }
LAB_0075e18e:
    uVar5 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return uVar5;
  }
LAB_0075e1e6:
  __stack_chk_fail();
}

Assistant:

T LocaleIndependentAtoi(std::string_view str)
{
    static_assert(std::is_integral<T>::value);
    T result;
    // Emulate atoi(...) handling of white space and leading +/-.
    std::string_view s = util::TrimStringView(str);
    if (!s.empty() && s[0] == '+') {
        if (s.length() >= 2 && s[1] == '-') {
            return 0;
        }
        s = s.substr(1);
    }
    auto [_, error_condition] = std::from_chars(s.data(), s.data() + s.size(), result);
    if (error_condition == std::errc::result_out_of_range) {
        if (s.length() >= 1 && s[0] == '-') {
            // Saturate underflow, per strtoll's behavior.
            return std::numeric_limits<T>::min();
        } else {
            // Saturate overflow, per strtoll's behavior.
            return std::numeric_limits<T>::max();
        }
    } else if (error_condition != std::errc{}) {
        return 0;
    }
    return result;
}